

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,mbedtls_mpi *tmp
                  )

{
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *X_00;
  int iVar2;
  int iVar3;
  mbedtls_mpi *pmVar4;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  
  X = tmp + 1;
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar2 = mbedtls_mpi_mul_mod(grp,X,&P->Z,&P->Z);
    if (iVar2 != 0) {
      return iVar2;
    }
    pmVar1 = tmp + 2;
    iVar2 = mbedtls_mpi_add_mpi(pmVar1,&P->X,X);
    if (iVar2 == 0) {
      do {
        iVar2 = mbedtls_mpi_cmp_mpi(pmVar1,&grp->P);
        if (iVar2 < 0) {
          iVar2 = 0;
          break;
        }
        iVar2 = mbedtls_mpi_sub_abs(pmVar1,pmVar1,&grp->P);
      } while (iVar2 == 0);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    pmVar4 = tmp + 3;
    iVar2 = mbedtls_mpi_sub_mpi(pmVar4,&P->X,X);
    if (iVar2 == 0) {
      while (tmp[3].s < 0) {
        iVar2 = 0;
        iVar3 = mbedtls_mpi_cmp_int(pmVar4,0);
        if ((iVar3 == 0) || (iVar2 = mbedtls_mpi_add_mpi(pmVar4,pmVar4,&grp->P), iVar2 != 0))
        goto LAB_001bfaa5;
      }
      iVar2 = 0;
    }
LAB_001bfaa5:
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_mul_mod(grp,X,pmVar1,pmVar4);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_mul_int_mod(grp,tmp,X,(mbedtls_mpi_uint)pmVar4);
  }
  else {
    iVar2 = mbedtls_mpi_mul_mod(grp,X,&P->X,&P->X);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_mul_int(tmp,X,3);
    if (iVar2 == 0) {
      do {
        iVar2 = mbedtls_mpi_cmp_mpi(tmp,&grp->P);
        if (iVar2 < 0) {
          iVar2 = 0;
          break;
        }
        iVar2 = mbedtls_mpi_sub_abs(tmp,tmp,&grp->P);
      } while (iVar2 == 0);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_cmp_int(&grp->A,0);
    if (iVar2 == 0) goto LAB_001bfae5;
    iVar2 = mbedtls_mpi_mul_mod(grp,X,&P->Z,&P->Z);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_mul_mod(grp,tmp + 2,X,X);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_mul_mod(grp,X,tmp + 2,&grp->A);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_mpi_add_mod(grp,tmp,tmp,X);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
LAB_001bfae5:
  pmVar1 = tmp + 2;
  pmVar4 = &P->Y;
  iVar2 = mbedtls_mpi_mul_mod(grp,pmVar1,pmVar4,pmVar4);
  if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l_mod(grp,pmVar1,count), iVar2 == 0)) &&
      (iVar2 = mbedtls_mpi_mul_mod(grp,X,&P->X,pmVar1), iVar2 == 0)) &&
     (iVar2 = mbedtls_mpi_shift_l_mod(grp,X,count_00), iVar2 == 0)) {
    X_00 = tmp + 3;
    iVar2 = mbedtls_mpi_mul_mod(grp,X_00,pmVar1,pmVar1);
    if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l_mod(grp,X_00,count_01), iVar2 == 0)) &&
        ((iVar2 = mbedtls_mpi_mul_mod(grp,pmVar1,tmp,tmp), iVar2 == 0 &&
         ((iVar2 = mbedtls_mpi_sub_mod(grp,pmVar1,pmVar1,X), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_sub_mod(grp,pmVar1,pmVar1,X), iVar2 == 0)))))) &&
       ((iVar2 = mbedtls_mpi_sub_mod(grp,X,X,pmVar1), iVar2 == 0 &&
        (((((iVar2 = mbedtls_mpi_mul_mod(grp,X,X,tmp), iVar2 == 0 &&
            (iVar2 = mbedtls_mpi_sub_mod(grp,X,X,X_00), iVar2 == 0)) &&
           (iVar2 = mbedtls_mpi_mul_mod(grp,X_00,pmVar4,&P->Z), iVar2 == 0)) &&
          ((iVar2 = mbedtls_mpi_shift_l_mod(grp,X_00,count_02), iVar2 == 0 &&
           (iVar2 = mbedtls_mpi_copy(&R->X,pmVar1), iVar2 == 0)))) &&
         (iVar2 = mbedtls_mpi_copy(&R->Y,X), iVar2 == 0)))))) {
      iVar2 = mbedtls_mpi_copy(&R->Z,X_00);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int ecp_double_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P,
                          mbedtls_mpi tmp[4])
{
#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_double_jac(grp, R, P);
    }
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Special case for A = -3 */
    if (mbedtls_ecp_group_a_is_minus_3(grp)) {
        /* tmp[0] <- M = 3(X + Z^2)(X - Z^2) */
        MPI_ECP_SQR(&tmp[1],  &P->Z);
        MPI_ECP_ADD(&tmp[2],  &P->X,  &tmp[1]);
        MPI_ECP_SUB(&tmp[3],  &P->X,  &tmp[1]);
        MPI_ECP_MUL(&tmp[1],  &tmp[2],     &tmp[3]);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],     3);
    } else {
        /* tmp[0] <- M = 3.X^2 + A.Z^4 */
        MPI_ECP_SQR(&tmp[1],  &P->X);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],  3);

        /* Optimize away for "koblitz" curves with A = 0 */
        if (MPI_ECP_CMP_INT(&grp->A, 0) != 0) {
            /* M += A.Z^4 */
            MPI_ECP_SQR(&tmp[1],  &P->Z);
            MPI_ECP_SQR(&tmp[2],  &tmp[1]);
            MPI_ECP_MUL(&tmp[1],  &tmp[2],     &grp->A);
            MPI_ECP_ADD(&tmp[0],  &tmp[0],     &tmp[1]);
        }
    }

    /* tmp[1] <- S = 4.X.Y^2 */
    MPI_ECP_SQR(&tmp[2],  &P->Y);
    MPI_ECP_SHIFT_L(&tmp[2],  1);
    MPI_ECP_MUL(&tmp[1],  &P->X, &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[1],  1);

    /* tmp[3] <- U = 8.Y^4 */
    MPI_ECP_SQR(&tmp[3],  &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* tmp[2] <- T = M^2 - 2.S */
    MPI_ECP_SQR(&tmp[2],  &tmp[0]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);

    /* tmp[1] <- S = M(S - T) - U */
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[2]);
    MPI_ECP_MUL(&tmp[1],  &tmp[1],     &tmp[0]);
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[3]);

    /* tmp[3] <- U = 2.Y.Z */
    MPI_ECP_MUL(&tmp[3],  &P->Y,  &P->Z);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* Store results */
    MPI_ECP_MOV(&R->X, &tmp[2]);
    MPI_ECP_MOV(&R->Y, &tmp[1]);
    MPI_ECP_MOV(&R->Z, &tmp[3]);

cleanup:

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_DOUBLE_JAC_ALT) */
}